

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5StructureDecode(u8 *pData,int nData,int *piCookie,Fts5Structure **ppOut)

{
  int *piVar1;
  u32 uVar2;
  u8 *puVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Fts5StructureSegment *pFVar9;
  ulong uVar10;
  u32 *v;
  Fts5StructureLevel *v_00;
  ulong uVar11;
  u32 uVar12;
  int rc;
  int nTotal;
  int nLevel;
  int local_90;
  uint local_8c;
  ulong local_88;
  ulong local_80;
  int local_78;
  u32 local_74;
  ulong local_70;
  u8 *local_68;
  uint local_5c;
  u32 local_58;
  u32 local_54;
  Fts5Structure *local_50;
  Fts5Structure **local_48;
  ulong local_40;
  Fts5StructureLevel *local_38;
  
  local_90 = 0;
  local_54 = 0;
  local_58 = 0;
  if (piCookie != (int *)0x0) {
    uVar5 = *(uint *)pData;
    *piCookie = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
  }
  local_78 = nData;
  uVar5 = sqlite3Fts5GetVarint32(pData + 4,&local_54);
  iVar6 = sqlite3Fts5GetVarint32(pData + (ulong)uVar5 + 4,&local_58);
  uVar12 = local_58;
  local_80 = (ulong)(int)local_54;
  iVar7 = 0x10b;
  if (local_58 < 0x7d1 && local_80 < 0x7d1) {
    local_70 = local_80 - 1;
    local_68 = pData;
    local_50 = (Fts5Structure *)sqlite3Fts5MallocZero(&local_90,local_70 * 0x10 + 0x28);
    uVar10 = local_80;
    iVar7 = local_90;
    local_48 = ppOut;
    if (local_50 == (Fts5Structure *)0x0) {
      local_50 = (Fts5Structure *)0x0;
    }
    else {
      uVar5 = uVar5 + iVar6 + 4;
      local_50->nRef = 1;
      local_50->nLevel = (int)local_80;
      local_50->nSegment = uVar12;
      bVar4 = sqlite3Fts5GetVarint(local_68 + uVar5,&local_50->nWriteCounter);
      iVar6 = bVar4 + uVar5;
      local_38 = local_50->aLevel;
      local_40 = local_70 & 0xffffffff;
      for (uVar11 = 0; (puVar3 = local_68, iVar7 == 0 && (uVar11 < uVar10)); uVar11 = uVar11 + 1) {
        local_74 = 0;
        if (iVar6 < local_78) {
          v_00 = local_38 + uVar11;
          local_88 = uVar11;
          iVar7 = sqlite3Fts5GetVarint32(local_68 + iVar6,(u32 *)v_00);
          iVar8 = sqlite3Fts5GetVarint32(puVar3 + (iVar7 + iVar6),&local_74);
          uVar2 = local_74;
          if ((int)local_74 < v_00->nMerge) {
            local_90 = 0x10b;
          }
          iVar6 = iVar7 + iVar6 + iVar8;
          pFVar9 = (Fts5StructureSegment *)
                   sqlite3Fts5MallocZero(&local_90,(long)(int)local_74 * 0xc);
          v_00->aSeg = pFVar9;
          uVar12 = uVar12 - uVar2;
          uVar10 = local_80;
          uVar11 = local_88;
          iVar7 = local_90;
          if (local_90 == 0) {
            uVar10 = 0;
            if (0 < (int)uVar2) {
              uVar10 = (ulong)uVar2;
            }
            local_5c = uVar2;
            v_00->nSeg = uVar2;
            local_70 = uVar10 * 0xc + 0xc;
            uVar10 = 0;
            local_8c = uVar12;
            do {
              puVar3 = local_68;
              if (local_70 == uVar10 + 0xc) {
                iVar7 = 0;
                goto LAB_001b487d;
              }
              if (local_78 <= iVar6) break;
              pFVar9 = v_00->aSeg;
              iVar7 = sqlite3Fts5GetVarint32
                                (local_68 + iVar6,(u32 *)((long)&pFVar9->iSegid + uVar10));
              iVar8 = sqlite3Fts5GetVarint32
                                (puVar3 + (iVar7 + iVar6),(u32 *)((long)&pFVar9->pgnoFirst + uVar10)
                                );
              iVar8 = iVar7 + iVar6 + iVar8;
              v = (u32 *)((long)&pFVar9->pgnoLast + uVar10);
              iVar6 = sqlite3Fts5GetVarint32(puVar3 + iVar8,v);
              iVar6 = iVar8 + iVar6;
              piVar1 = (int *)((long)&pFVar9->pgnoFirst + uVar10);
              uVar10 = uVar10 + 0xc;
            } while (*piVar1 <= (int)*v);
            local_90 = 0x10b;
            iVar7 = 0x10b;
LAB_001b487d:
            if (((local_88 != 0) && (local_5c == 0)) && ((u32)*(u64 *)(v_00 + -1) != 0)) {
              local_90 = 0x10b;
              iVar7 = 0x10b;
            }
            uVar10 = local_80;
            uVar11 = local_88;
            uVar12 = local_8c;
            if ((local_88 == local_40) && (v_00->nMerge != 0)) {
              local_90 = 0x10b;
              iVar7 = 0x10b;
            }
          }
        }
        else {
          local_90 = 0x10b;
          iVar7 = 0x10b;
        }
      }
      if (uVar12 == 0 && iVar7 == 0) {
        iVar7 = 0;
      }
      else {
        iVar6 = 0x10b;
        if (uVar12 == 0) {
          iVar6 = iVar7;
        }
        if (iVar7 == 0) {
          iVar7 = iVar6;
        }
        fts5StructureRelease(local_50);
        local_50 = (Fts5Structure *)0x0;
      }
    }
    *local_48 = local_50;
  }
  return iVar7;
}

Assistant:

static int fts5StructureDecode(
  const u8 *pData,                /* Buffer containing serialized structure */
  int nData,                      /* Size of buffer pData in bytes */
  int *piCookie,                  /* Configuration cookie value */
  Fts5Structure **ppOut           /* OUT: Deserialized object */
){
  int rc = SQLITE_OK;
  int i = 0;
  int iLvl;
  int nLevel = 0;
  int nSegment = 0;
  sqlite3_int64 nByte;            /* Bytes of space to allocate at pRet */
  Fts5Structure *pRet = 0;        /* Structure object to return */

  /* Grab the cookie value */
  if( piCookie ) *piCookie = sqlite3Fts5Get32(pData);
  i = 4;

  /* Read the total number of levels and segments from the start of the
  ** structure record.  */
  i += fts5GetVarint32(&pData[i], nLevel);
  i += fts5GetVarint32(&pData[i], nSegment);
  if( nLevel>FTS5_MAX_SEGMENT   || nLevel<0
   || nSegment>FTS5_MAX_SEGMENT || nSegment<0
  ){
    return FTS5_CORRUPT;
  }
  nByte = (
      sizeof(Fts5Structure) +                    /* Main structure */
      sizeof(Fts5StructureLevel) * (nLevel-1)    /* aLevel[] array */
  );
  pRet = (Fts5Structure*)sqlite3Fts5MallocZero(&rc, nByte);

  if( pRet ){
    pRet->nRef = 1;
    pRet->nLevel = nLevel;
    pRet->nSegment = nSegment;
    i += sqlite3Fts5GetVarint(&pData[i], &pRet->nWriteCounter);

    for(iLvl=0; rc==SQLITE_OK && iLvl<nLevel; iLvl++){
      Fts5StructureLevel *pLvl = &pRet->aLevel[iLvl];
      int nTotal = 0;
      int iSeg;

      if( i>=nData ){
        rc = FTS5_CORRUPT;
      }else{
        i += fts5GetVarint32(&pData[i], pLvl->nMerge);
        i += fts5GetVarint32(&pData[i], nTotal);
        if( nTotal<pLvl->nMerge ) rc = FTS5_CORRUPT;
        pLvl->aSeg = (Fts5StructureSegment*)sqlite3Fts5MallocZero(&rc, 
            nTotal * sizeof(Fts5StructureSegment)
        );
        nSegment -= nTotal;
      }

      if( rc==SQLITE_OK ){
        pLvl->nSeg = nTotal;
        for(iSeg=0; iSeg<nTotal; iSeg++){
          Fts5StructureSegment *pSeg = &pLvl->aSeg[iSeg];
          if( i>=nData ){
            rc = FTS5_CORRUPT;
            break;
          }
          i += fts5GetVarint32(&pData[i], pSeg->iSegid);
          i += fts5GetVarint32(&pData[i], pSeg->pgnoFirst);
          i += fts5GetVarint32(&pData[i], pSeg->pgnoLast);
          if( pSeg->pgnoLast<pSeg->pgnoFirst ){
            rc = FTS5_CORRUPT;
            break;
          }
        }
        if( iLvl>0 && pLvl[-1].nMerge && nTotal==0 ) rc = FTS5_CORRUPT;
        if( iLvl==nLevel-1 && pLvl->nMerge ) rc = FTS5_CORRUPT;
      }
    }
    if( nSegment!=0 && rc==SQLITE_OK ) rc = FTS5_CORRUPT;

    if( rc!=SQLITE_OK ){
      fts5StructureRelease(pRet);
      pRet = 0;
    }
  }

  *ppOut = pRet;
  return rc;
}